

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

void Jf_ObjComputeCuts(Jf_Man_t *p,Gia_Obj_t *pObj,int fEdge)

{
  int *piVar1;
  uint uVar2;
  Sdm_Man_t *p_00;
  Jf_Cut_t *pJVar3;
  Vec_Int_t *p_01;
  int Var;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Jf_Cut_t *pJVar9;
  int *piVar10;
  word wVar11;
  uint *puVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint *puVar20;
  undefined8 uVar21;
  Jf_Par_t *pJVar22;
  long lVar23;
  uint *pCut0;
  ulong uVar24;
  uint uMask;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  int local_6a8;
  Jf_Cut_t *pSto [18];
  word Sign1 [18];
  word Sign0 [18];
  Jf_Cut_t Sto [18];
  
  iVar7 = p->pPars->nLutSize;
  uVar8 = p->pPars->nCutNum;
  Var = Gia_ObjId(p->pGia,pObj);
  pJVar9 = Sto;
  for (lVar15 = 0; lVar15 <= (long)(int)uVar8 + 1; lVar15 = lVar15 + 1) {
    pSto[lVar15] = pJVar9;
    pJVar9->iFunc = -1;
    pJVar9->Cost = 0;
    pJVar9 = pJVar9 + 1;
  }
  piVar10 = Jf_ObjCuts(p,Var - (*(uint *)pObj & 0x1fffffff));
  pCut0 = (uint *)(piVar10 + 1);
  puVar20 = pCut0;
  for (lVar15 = 0; lVar15 < *piVar10; lVar15 = lVar15 + 1) {
    wVar11 = Jf_CutGetSign((int *)puVar20);
    Sign0[lVar15] = wVar11;
    puVar20 = puVar20 + (ulong)(*puVar20 & 0xf) + 1;
  }
  puVar12 = (uint *)Jf_ObjCuts(p,Var - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
  lVar15 = 0;
  puVar20 = puVar12 + 1;
  while( true ) {
    uVar13 = (ulong)(int)*puVar12;
    if ((long)uVar13 <= lVar15) break;
    wVar11 = Jf_CutGetSign((int *)puVar20);
    Sign1[lVar15] = wVar11;
    lVar15 = lVar15 + 1;
    puVar20 = puVar20 + (ulong)(*puVar20 & 0xf) + 1;
  }
  iVar4 = *piVar10;
  p->CutCount[0] = p->CutCount[0] + (long)(int)(iVar4 * *puVar12);
  uVar25 = 0;
  for (lVar15 = 0; lVar15 < iVar4; lVar15 = lVar15 + 1) {
    puVar20 = puVar12 + 1;
    for (lVar23 = 0; lVar23 < (int)uVar13; lVar23 = lVar23 + 1) {
      uVar24 = Sign1[lVar23] | Sign0[lVar15];
      uVar13 = uVar24 - (uVar24 >> 1 & 0x5555555555555555);
      uVar13 = (uVar13 >> 2 & 0x3333333333333333) + (uVar13 & 0x3333333333333333);
      uVar27 = (uint)uVar25;
      uVar18 = uVar27;
      if ((int)(uint)(byte)(((uVar13 >> 4) + uVar13 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38
                           ) <= iVar7) {
        p->CutCount[1] = p->CutCount[1] + 1;
        lVar16 = (long)(int)uVar27;
        if (p->pPars->fCutMin == 0) {
          pJVar9 = pSto[(int)uVar27];
          iVar4 = Jf_CutMergeOrder((int *)pCut0,(int *)puVar20,pJVar9->pCut,iVar7);
          if (iVar4 != 0) {
            pJVar9->Sign = uVar24;
LAB_005e5543:
            p->CutCount[2] = p->CutCount[2] + 1;
            iVar4 = 0;
            if (p->pPars->fAreaOnly == 0) {
              iVar4 = Jf_CutArr(p,pJVar9->pCut);
            }
            pJVar9->Time = iVar4;
            piVar1 = pJVar9->pCut;
            fVar28 = Jf_CutFlow(p,piVar1);
            pJVar9->Flow = fVar28;
            uVar18 = 1;
            if (uVar27 != 0) {
              if ((uVar27 == uVar8) &&
                 (fVar28 = (*p->pCutCmp)(pSto[lVar16 + -1],pJVar9), uVar18 = uVar8, fVar28 <= 0.0))
              goto LAB_005e583d;
              if ((int)uVar8 < (int)uVar27) {
                __assert_fail("c <= cMax",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                              ,0x3c9,"int Jf_ObjAddCutToStore(Jf_Man_t *, Jf_Cut_t **, int, int)");
              }
              uVar18 = uVar27 + 1;
              do {
                uVar19 = (int)uVar27 >> 0x1f & uVar27;
                if ((int)uVar25 < 1) break;
                lVar14 = uVar25 - 1;
                uVar25 = uVar25 - 1;
                fVar28 = (*p->pCutCmp)(pSto[lVar14],pJVar9);
                uVar18 = uVar18 - 1;
                uVar19 = uVar18;
              } while (0.0 <= fVar28);
              uVar13 = 0;
              if (0 < (int)uVar19) {
                uVar13 = (ulong)uVar19;
              }
              if (p->pPars->fCutMin == 0) {
                for (uVar25 = 0; uVar13 != uVar25; uVar25 = uVar25 + 1) {
                  pJVar3 = pSto[uVar25];
                  if (((pJVar3->pCut[0] <= *piVar1) && ((pJVar3->Sign & ~pJVar9->Sign) == 0)) &&
                     (iVar4 = Jf_CutIsContainedOrder(piVar1,pJVar3->pCut), uVar18 = uVar27,
                     iVar4 != 0)) goto LAB_005e57fc;
                }
              }
              else {
                for (uVar25 = 0; uVar13 != uVar25; uVar25 = uVar25 + 1) {
                  pJVar3 = pSto[uVar25];
                  if (((pJVar3->pCut[0] <= *piVar1) && ((pJVar3->Sign & ~pJVar9->Sign) == 0)) &&
                     (iVar4 = Jf_CutIsContained1(piVar1,pJVar3->pCut), uVar18 = uVar27, iVar4 != 0))
                  goto LAB_005e57fc;
                }
              }
              lVar26 = (long)(int)uVar19;
              for (lVar14 = lVar16; lVar26 < lVar14; lVar14 = lVar14 + -1) {
                pSto[lVar14] = pSto[lVar14 + -1];
              }
              pSto[lVar26] = pJVar9;
              iVar4 = uVar19 + 1;
              lVar14 = (long)iVar4;
              if (p->pPars->fCutMin == 0) {
                for (; lVar14 <= lVar16; lVar14 = lVar14 + 1) {
                  pJVar9 = pSto[lVar26];
                  pJVar3 = pSto[lVar14];
                  if ((((pJVar3->pCut[0] < pJVar9->pCut[0]) || ((pJVar9->Sign & ~pJVar3->Sign) != 0)
                       ) || (iVar6 = Jf_CutIsContainedOrder(pJVar3->pCut,pJVar9->pCut),
                            iVar5 = iVar4, iVar6 == 0)) && (iVar5 = iVar4 + 1, (int)lVar14 != iVar4)
                     ) {
                    pJVar9 = pSto[iVar4];
                    pSto[iVar4] = pJVar3;
                    pSto[lVar14] = pJVar9;
                  }
                  iVar4 = iVar5;
                }
              }
              else {
                for (; lVar14 <= lVar16; lVar14 = lVar14 + 1) {
                  pJVar9 = pSto[lVar26];
                  pJVar3 = pSto[lVar14];
                  if ((((pJVar3->pCut[0] < pJVar9->pCut[0]) || ((pJVar9->Sign & ~pJVar3->Sign) != 0)
                       ) || (iVar6 = Jf_CutIsContained1(pJVar3->pCut,pJVar9->pCut), iVar5 = iVar4,
                            iVar6 == 0)) && (iVar5 = iVar4 + 1, (int)lVar14 != iVar4)) {
                    pJVar9 = pSto[iVar4];
                    pSto[iVar4] = pJVar3;
                    pSto[lVar14] = pJVar9;
                  }
                  iVar4 = iVar5;
                }
              }
              local_6a8 = (int)((long)(int)uVar8 + 1);
              uVar18 = iVar4 - (uint)(iVar4 == local_6a8);
            }
LAB_005e57fc:
            if ((int)uVar8 < (int)uVar18) {
              __assert_fail("c <= CutNum",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                            ,0x4ab,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
            }
          }
        }
        else {
          pJVar9 = pSto[lVar16];
          piVar1 = pJVar9->pCut;
          if (p->pPars->fFuncDsd == 0) {
            iVar4 = Jf_CutMergeOrder((int *)pCut0,(int *)puVar20,piVar1,iVar7);
            if (iVar4 != 0) {
              pJVar9->Sign = uVar24;
              iVar4 = pJVar9->pCut[0];
              iVar5 = Jf_ObjFunc0(pObj,(int *)pCut0);
              iVar6 = Jf_ObjFunc1(pObj,(int *)puVar20);
              iVar5 = Jf_TtComputeForCut(p,iVar5,iVar6,(int *)pCut0,(int *)puVar20,piVar1);
              pJVar9->iFunc = iVar5;
              if (iVar4 < pJVar9->pCut[0]) {
                __assert_fail("pSto[c]->pCut[0] <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                              ,0x4a1,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
              }
              if (pJVar9->pCut[0] < iVar4) {
                wVar11 = Jf_CutGetSign(piVar1);
                pJVar9->Sign = wVar11;
                iVar5 = pJVar9->iFunc;
              }
              if (0xffffff < iVar5) {
                puts(
                    "Hard limit on the number of different Boolean functions (2^23) is reached. Quitting..."
                    );
                exit(1);
              }
              goto LAB_005e5543;
            }
          }
          else {
            uVar17 = *pCut0 & 0xf;
            uVar19 = *puVar20;
            *piVar1 = uVar17;
            uMask = 0x3ffff;
            for (uVar13 = 0; (uVar19 & 0xf) != uVar13; uVar13 = uVar13 + 1) {
              iVar4 = Abc_Lit2Var(puVar20[uVar13 + 1]);
              iVar4 = Jf_CutFindLeaf1((int *)pCut0,iVar4);
              if ((int)uVar17 < iVar4) {
                iVar5 = *piVar1;
                if (iVar5 == iVar7) goto LAB_005e583d;
                uVar2 = puVar20[uVar13 + 1];
                iVar4 = iVar5 + 1;
                *piVar1 = iVar4;
                pJVar9->pCut[(long)iVar5 + 1] = uVar2;
              }
              else if (pCut0[iVar4] != puVar20[uVar13 + 1]) {
                uMask = uMask | 1 << (iVar4 + 0x11U & 0x1f);
              }
              uMask = uMask ^ ((uint)uVar13 ^ 7) << ((char)iVar4 * '\x03' - 3U & 0x1f);
            }
            memcpy(pJVar9->pCut + 1,pCut0 + 1,(ulong)(uVar17 << 2));
            if (uMask != 0) {
              pJVar9->Sign = uVar24;
              iVar4 = pJVar9->pCut[0];
              p_00 = p->pDsd;
              iVar5 = Jf_ObjFunc0(pObj,(int *)pCut0);
              iVar6 = Jf_ObjFunc1(pObj,(int *)puVar20);
              iVar5 = Sdm_ManComputeFunc(p_00,iVar5,iVar6,piVar1,uMask,0);
              pJVar9->iFunc = iVar5;
              if (iVar5 != -1) {
                if (p->pPars->fGenCnf != 0) {
                  iVar5 = Abc_Lit2Var(iVar5);
                  iVar5 = Jf_CutCnfSizeF(p,iVar5);
                  if (0xb < iVar5) goto LAB_005e583d;
                }
                if (iVar4 < *piVar1) {
                  __assert_fail("pSto[c]->pCut[0] <= nOldSupp",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                                ,0x496,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
                }
                if (*piVar1 < iVar4) {
                  wVar11 = Jf_CutGetSign(piVar1);
                  pJVar9->Sign = wVar11;
                }
                goto LAB_005e5543;
              }
            }
          }
        }
      }
LAB_005e583d:
      puVar20 = puVar20 + (ulong)(*puVar20 & 0xf) + 1;
      uVar13 = (ulong)*puVar12;
      uVar25 = (ulong)uVar18;
    }
    pCut0 = pCut0 + (ulong)(*pCut0 & 0xf) + 1;
    iVar4 = *piVar10;
  }
  uVar21 = *(undefined8 *)pObj;
  if (((uint)uVar21 >> 0x1e & 1) != 0) {
    iVar4 = (int)uVar25;
    iVar7 = Jf_ObjHasCutWithSize(pSto,iVar4,2);
    if (iVar7 == 0) {
      if (((pObj[-(ulong)((uint)uVar21 & 0x1fffffff)].field_0x3 & 0x40) != 0) ||
         ((pObj[-(ulong)((uint)((ulong)uVar21 >> 0x20) & 0x1fffffff)].field_0x3 & 0x40) != 0)) {
        __assert_fail("Jf_ObjIsUnit(Gia_ObjFanin0(pObj)) && Jf_ObjIsUnit(Gia_ObjFanin1(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                      ,0x4b2,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
      }
      pJVar9 = pSto[iVar4];
      if (p->pPars->fCutMin != 0) {
        pJVar9->iFunc = 4;
      }
      pJVar9->pCut[0] = 2;
      iVar7 = Abc_Var2Lit(Var - (*(uint *)pObj & 0x1fffffff),*(uint *)pObj >> 0x1d & 1);
      pJVar9->pCut[1] = iVar7;
      uVar8 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
      iVar7 = Abc_Var2Lit(Var - (uVar8 & 0x1fffffff),uVar8 >> 0x1d & 1);
      pJVar9->pCut[2] = iVar7;
      uVar25 = (ulong)(iVar4 + 1);
      uVar21 = *(undefined8 *)pObj;
    }
  }
  pJVar22 = p->pPars;
  if (((uint)uVar21 >> 0x1e & 1) == 0) {
    iVar7 = (int)uVar25;
    if (pJVar22->fCutMin == 0) {
      pJVar9 = pSto[iVar7];
    }
    else {
      iVar4 = Jf_ObjHasCutWithSize(pSto,iVar7,1);
      if (iVar4 != 0) goto LAB_005e59d5;
      pJVar9 = pSto[iVar7];
      pJVar9->iFunc = 2;
    }
    pJVar9->pCut[0] = 1;
    iVar4 = Abc_Var2Lit(Var,0);
    pJVar9->pCut[1] = iVar4;
    uVar25 = (ulong)(iVar7 + 1);
    pJVar22 = p->pPars;
  }
LAB_005e59d5:
  if (pJVar22->fGenCnf == 0) {
    pSto[0]->Cost = 1;
  }
  else {
    iVar7 = Abc_Lit2Var(pSto[0]->iFunc);
    iVar7 = Jf_CutCnfSizeF(p,iVar7);
    pSto[0]->Cost = iVar7;
    if (iVar7 < 0) {
      __assert_fail("pSto[0]->Cost >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                    ,0x4c6,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
    }
  }
  if (pSto[0]->Flow < 0.0) {
    __assert_fail("pSto[0]->Flow >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                  ,0x4c8,"void Jf_ObjComputeCuts(Jf_Man_t *, Gia_Obj_t *, int)");
  }
  Vec_IntWriteEntry(&p->vArr,Var,pSto[0]->Time);
  iVar7 = pSto[0]->pCut[(ulong)(fEdge != 0) - 1];
  fVar28 = pSto[0]->Flow;
  fVar29 = Vec_FltEntry(&p->vRefs,Var);
  Vec_FltWriteEntry(&p->vFlow,Var,((float)iVar7 + fVar28) / fVar29);
  p_01 = p->vTemp;
  p_01->nSize = 0;
  iVar7 = (int)uVar25;
  Vec_IntPush(p_01,iVar7);
  uVar24 = 0;
  uVar13 = 0;
  if (0 < iVar7) {
    uVar13 = uVar25;
  }
  for (; uVar24 != uVar13; uVar24 = uVar24 + 1) {
    pJVar9 = pSto[uVar24];
    iVar4 = 1;
    if (p->pPars->fGenCnf != 0) {
      iVar4 = Abc_Lit2Var(pJVar9->iFunc);
      iVar4 = Jf_CutCnfSizeF(p,iVar4);
    }
    pJVar9->Cost = iVar4;
    Vec_IntPush(p->vTemp,iVar4 << 4 | pJVar9->iFunc << 8 | pJVar9->pCut[0]);
    for (lVar15 = 7; lVar15 + -6 <= (long)pJVar9->pCut[0]; lVar15 = lVar15 + 1) {
      Vec_IntPush(p->vTemp,pJVar9->pCut[lVar15 + -6]);
    }
  }
  iVar4 = Vec_SetAppend(&p->pMem,p->vTemp->pArray,p->vTemp->nSize);
  Vec_IntWriteEntry(&p->vCuts,Var,iVar4);
  p->CutCount[3] = p->CutCount[3] + (long)iVar7;
  return;
}

Assistant:

void Jf_ObjComputeCuts( Jf_Man_t * p, Gia_Obj_t * pObj, int fEdge )
{
    int        LutSize = p->pPars->nLutSize;
    int        CutNum = p->pPars->nCutNum;
    int        iObj = Gia_ObjId(p->pGia, pObj);
    word       Sign0[JF_CUT_MAX+2]; // signatures of the first cut
    word       Sign1[JF_CUT_MAX+2]; // signatures of the second cut
    Jf_Cut_t   Sto[JF_CUT_MAX+2];   // cut storage
    Jf_Cut_t * pSto[JF_CUT_MAX+2];  // pointers to cut storage
    int *      pCut0, * pCut1, * pCuts0, * pCuts1;
    int        nOldSupp, Config, i, k, c = 0;
    // prepare cuts
    for ( i = 0; i <= CutNum+1; i++ )
        pSto[i] = Sto + i, pSto[i]->Cost = 0, pSto[i]->iFunc = ~0;
    // compute signatures
    pCuts0 = Jf_ObjCuts( p, Gia_ObjFaninId0(pObj, iObj) );
    Jf_ObjForEachCut( pCuts0, pCut0, i )
        Sign0[i] = Jf_CutGetSign( pCut0 );
    // compute signatures
    pCuts1 = Jf_ObjCuts( p, Gia_ObjFaninId1(pObj, iObj) );
    Jf_ObjForEachCut( pCuts1, pCut1, i )
        Sign1[i] = Jf_CutGetSign( pCut1 );
    // merge cuts
    p->CutCount[0] += pCuts0[0] * pCuts1[0];
    Jf_ObjForEachCut( pCuts0, pCut0, i )
    Jf_ObjForEachCut( pCuts1, pCut1, k )
    {
        if ( Jf_CountBits(Sign0[i] | Sign1[k]) > LutSize )
            continue;
        p->CutCount[1]++;        
        if ( !p->pPars->fCutMin )
        {
            if ( !Jf_CutMergeOrder(pCut0, pCut1, pSto[c]->pCut, LutSize) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
        }
        else if ( p->pPars->fFuncDsd )
        {
            if ( !(Config = Jf_CutMerge2(pCut0, pCut1, pSto[c]->pCut, LutSize)) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
            nOldSupp = pSto[c]->pCut[0];
            pSto[c]->iFunc = Sdm_ManComputeFunc( p->pDsd, Jf_ObjFunc0(pObj, pCut0), Jf_ObjFunc1(pObj, pCut1), pSto[c]->pCut, Config, 0 );
            if ( pSto[c]->iFunc == -1 )
                continue;
            if ( p->pPars->fGenCnf && Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[c]->iFunc)) >= 12 ) // no more than 15
                continue;
            assert( pSto[c]->pCut[0] <= nOldSupp );
            if ( pSto[c]->pCut[0] < nOldSupp )
                pSto[c]->Sign = Jf_CutGetSign( pSto[c]->pCut );
        }
        else
        {
            if ( !Jf_CutMergeOrder(pCut0, pCut1, pSto[c]->pCut, LutSize) )
                continue;
            pSto[c]->Sign = Sign0[i] | Sign1[k];
            nOldSupp = pSto[c]->pCut[0];
            pSto[c]->iFunc = Jf_TtComputeForCut( p, Jf_ObjFunc0(pObj, pCut0), Jf_ObjFunc1(pObj, pCut1), pCut0, pCut1, pSto[c]->pCut );
            assert( pSto[c]->pCut[0] <= nOldSupp );
            if ( pSto[c]->pCut[0] < nOldSupp )
                pSto[c]->Sign = Jf_CutGetSign( pSto[c]->pCut );
            if ( pSto[c]->iFunc >= (1 << 24) )
                printf( "Hard limit on the number of different Boolean functions (2^23) is reached. Quitting...\n" ), exit(1);
        }
        p->CutCount[2]++;
        pSto[c]->Time = p->pPars->fAreaOnly ? 0 : Jf_CutArr(p, pSto[c]->pCut);
        pSto[c]->Flow = Jf_CutFlow(p, pSto[c]->pCut);
        c = Jf_ObjAddCutToStore( p, pSto, c, CutNum );
        assert( c <= CutNum );
    }
//    Jf_ObjPrintStore( p, pSto, c );
//    Jf_ObjCheckStore( p, pSto, c, iObj );
    // add two variable cut
    if ( !Jf_ObjIsUnit(pObj) && !Jf_ObjHasCutWithSize(pSto, c, 2) )
    {
        assert( Jf_ObjIsUnit(Gia_ObjFanin0(pObj)) && Jf_ObjIsUnit(Gia_ObjFanin1(pObj)) );
        if ( p->pPars->fCutMin ) pSto[c]->iFunc = 4;  // set function (DSD only!)
        pSto[c]->pCut[0] = 2; 
        pSto[c]->pCut[1] = Jf_ObjLit(Gia_ObjFaninId0(pObj, iObj), Gia_ObjFaninC0(pObj)); 
        pSto[c]->pCut[2] = Jf_ObjLit(Gia_ObjFaninId1(pObj, iObj), Gia_ObjFaninC1(pObj)); 
        c++;
    }
    // add elementary cut
    if ( Jf_ObjIsUnit(pObj) && !(p->pPars->fCutMin && Jf_ObjHasCutWithSize(pSto, c, 1)) )
    {
        if ( p->pPars->fCutMin ) pSto[c]->iFunc = 2;  // set function
        pSto[c]->pCut[0] = 1;
        pSto[c]->pCut[1] = Jf_ObjLit(iObj, 0);
        c++;
    }
    // reorder cuts
//    Jf_ObjSortCuts( pSto + 1, c - 1 );
//    Jf_ObjCheckPtrs( pSto, CutNum );
    // find cost of the best cut
    pSto[0]->Cost = p->pPars->fGenCnf ? Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[0]->iFunc)) : 1;
    assert( pSto[0]->Cost >= 0 );
    // save best info
    assert( pSto[0]->Flow >= 0 );
    Vec_IntWriteEntry( &p->vArr,  iObj, pSto[0]->Time );
    Vec_FltWriteEntry( &p->vFlow, iObj, (pSto[0]->Flow + (fEdge ? pSto[0]->pCut[0] : pSto[0]->Cost)) / Jf_ObjRefs(p, iObj) );
    // add cuts to storage cuts
    Vec_IntClear( p->vTemp );
    Vec_IntPush( p->vTemp, c );
    for ( i = 0; i < c; i++ )
    {
        pSto[i]->Cost = p->pPars->fGenCnf ? Jf_CutCnfSizeF(p, Abc_Lit2Var(pSto[i]->iFunc)) : 1;
        Vec_IntPush( p->vTemp, Jf_CutSetAll(pSto[i]->iFunc, pSto[i]->Cost, pSto[i]->pCut[0]) );
        for ( k = 1; k <= pSto[i]->pCut[0]; k++ )
            Vec_IntPush( p->vTemp, pSto[i]->pCut[k] );
    }
    Vec_IntWriteEntry( &p->vCuts, iObj, Vec_SetAppend(&p->pMem, Vec_IntArray(p->vTemp), Vec_IntSize(p->vTemp)) );
    p->CutCount[3] += c;
}